

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O1

int uECC_make_key(uint8_t *public_key,uint8_t *private_key,uECC_Curve curve)

{
  char cVar1;
  char cVar2;
  short sVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uECC_word_t uVar8;
  ulong uVar9;
  long lVar10;
  byte bVar11;
  ulong uVar12;
  uECC_word_t _private [4];
  uECC_word_t _public [8];
  uECC_word_t local_98 [4];
  uECC_word_t local_78 [9];
  
  lVar10 = 0x40;
  do {
    uVar7 = (int)curve->num_n_bits + 0x3f;
    uVar4 = (int)curve->num_n_bits + 0x7e;
    if (-1 < (int)uVar7) {
      uVar4 = uVar7;
    }
    iVar5 = uECC_generate_random_int(local_98,curve->n,(wordcount_t)(uVar4 >> 6));
    if (iVar5 == 0) {
      return 0;
    }
    uVar8 = EccPoint_compute_public_key(local_78,local_98,curve);
    if (uVar8 != 0) {
      sVar3 = curve->num_n_bits;
      iVar5 = sVar3 + 7;
      iVar6 = sVar3 + 0xe;
      if (-1 < iVar5) {
        iVar6 = iVar5;
      }
      if (0 < sVar3) {
        uVar7 = iVar6 >> 3;
        uVar9 = (ulong)uVar7;
        iVar5 = uVar7 * 8;
        uVar12 = 0;
        do {
          iVar5 = iVar5 + -8;
          uVar7 = uVar7 - 1;
          private_key[uVar12] =
               (uint8_t)(*(ulong *)((long)local_98 + (ulong)(uVar7 & 0xfffffff8)) >>
                        ((byte)iVar5 & 0x38));
          uVar12 = uVar12 + 1;
        } while (uVar12 != uVar9);
      }
      uVar7 = (uint)curve->num_bytes;
      if ('\0' < curve->num_bytes) {
        uVar9 = (ulong)uVar7;
        iVar5 = uVar7 * 8;
        uVar12 = 0;
        do {
          iVar5 = iVar5 + -8;
          uVar7 = uVar7 - 1;
          public_key[uVar12] =
               (uint8_t)(*(ulong *)((long)local_78 + (ulong)(uVar7 & 0xfffffff8)) >>
                        ((byte)iVar5 & 0x38));
          uVar12 = uVar12 + 1;
        } while (uVar12 != uVar9);
      }
      cVar1 = curve->num_bytes;
      if (0 < (long)cVar1) {
        cVar2 = curve->num_words;
        uVar7 = (uint)cVar1;
        uVar9 = (ulong)uVar7;
        bVar11 = cVar1 * '\b';
        uVar12 = 0;
        do {
          uVar7 = uVar7 - 1;
          bVar11 = bVar11 - 8;
          public_key[uVar12 + (long)cVar1] =
               (uint8_t)(*(ulong *)((long)local_78 + (ulong)(uVar7 & 0xfffffff8) + (long)cVar2 * 8)
                        >> (bVar11 & 0x38));
          uVar12 = uVar12 + 1;
        } while (uVar12 != uVar9);
      }
      return 1;
    }
    lVar10 = lVar10 + -1;
  } while (lVar10 != 0);
  return 0;
}

Assistant:

int uECC_make_key(uint8_t *public_key,
                  uint8_t *private_key,
                  uECC_Curve curve) {
#if uECC_VLI_NATIVE_LITTLE_ENDIAN
    uECC_word_t *_private = (uECC_word_t *)private_key;
    uECC_word_t *_public = (uECC_word_t *)public_key;
#else
    uECC_word_t _private[uECC_MAX_WORDS];
    uECC_word_t _public[uECC_MAX_WORDS * 2];
#endif
    uECC_word_t tries;

    for (tries = 0; tries < uECC_RNG_MAX_TRIES; ++tries) {
        if (!uECC_generate_random_int(_private, curve->n, BITS_TO_WORDS(curve->num_n_bits))) {
            return 0;
        }

        if (EccPoint_compute_public_key(_public, _private, curve)) {
#if uECC_VLI_NATIVE_LITTLE_ENDIAN == 0
            uECC_vli_nativeToBytes(private_key, BITS_TO_BYTES(curve->num_n_bits), _private);
            uECC_vli_nativeToBytes(public_key, curve->num_bytes, _public);
            uECC_vli_nativeToBytes(
                public_key + curve->num_bytes, curve->num_bytes, _public + curve->num_words);
#endif
            return 1;
        }
    }
    return 0;
}